

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O0

int * Extra_PermSchedule(int n)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int *__ptr;
  int local_3c;
  int local_38;
  int b;
  int k;
  int i;
  int *pRes0;
  int *pRes;
  int nGroups;
  int nFact;
  int n_local;
  
  iVar2 = Extra_Factorial(n);
  piVar3 = (int *)malloc((long)iVar2 << 2);
  local_3c = 0;
  if (n < 1) {
    __assert_fail("n > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilMisc.c"
                  ,0x8a4,"int *Extra_PermSchedule(int)");
  }
  if (n == 1) {
    *piVar3 = 0;
  }
  else if (n == 2) {
    piVar3[1] = 0;
    *piVar3 = 0;
  }
  else {
    __ptr = Extra_PermSchedule(n + -1);
    for (local_38 = 0;
        local_38 <
        (int)((long)((ulong)(uint)((int)((long)iVar2 / (long)n) >> 0x1f) << 0x20 |
                    (long)iVar2 / (long)n & 0xffffffffU) / 2); local_38 = local_38 + 1) {
      for (b = n + -1; 0 < b; b = b + -1) {
        piVar3[local_3c] = b + -1;
        local_3c = local_3c + 1;
      }
      piVar3[local_3c] = __ptr[local_38 << 1] + 1;
      iVar1 = local_3c;
      for (b = 0; local_3c = iVar1 + 1, b < n + -1; b = b + 1) {
        piVar3[local_3c] = b;
        iVar1 = local_3c;
      }
      piVar3[local_3c] = __ptr[local_38 * 2 + 1];
      local_3c = iVar1 + 2;
    }
    if (__ptr != (int *)0x0) {
      free(__ptr);
    }
    if (local_3c != iVar2) {
      __assert_fail("b == nFact",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilMisc.c"
                    ,0x8ba,"int *Extra_PermSchedule(int)");
    }
  }
  return piVar3;
}

Assistant:

int * Extra_PermSchedule( int n )
{
    int nFact   = Extra_Factorial(n);
    int nGroups = nFact / n / 2;
    int * pRes = ABC_ALLOC( int, nFact );
    int * pRes0, i, k, b = 0;
    assert( n > 0 );
    if ( n == 1 )
    {
        pRes[0] = 0;
        return pRes;
    }
    if ( n == 2 )
    {
        pRes[0] = pRes[1] = 0;
        return pRes;
    }
    pRes0 = Extra_PermSchedule( n-1 );
    for ( k = 0; k < nGroups; k++ )
    {
        for ( i = n-1; i > 0; i-- )
            pRes[b++] = i-1;
        pRes[b++] = pRes0[2*k]+1;
        for ( i = 0; i < n-1; i++ )
            pRes[b++] = i;
        pRes[b++] = pRes0[2*k+1];
    }
    ABC_FREE( pRes0 );
    assert( b == nFact );

    if ( 0 )
    {
        int Perm[16];
        for ( i = 0; i < n; i++ )
            Perm[i] = i;
        for ( b = 0; b < nFact; b++ )
        {
            ABC_SWAP( int, Perm[pRes[b]], Perm[pRes[b]+1] );
            printf( "%3d %3d    ", b, pRes[b] );
            for ( i = 0; i < n; i++ )
                printf( "%d", Perm[i] );
            printf( "\n" );
        }
    }
    return pRes;
}